

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64bd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *pr,int_t *q,int_t *l,double *d__)

{
  uint *puVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int_t *piVar13;
  uint uVar14;
  double *pdVar15;
  double *pdVar16;
  int_t *piVar17;
  int_t *piVar18;
  int_t *piVar19;
  long lVar20;
  int *piVar21;
  int_t *piVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  int_t c__1;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint *local_d8;
  ulong local_d0;
  int_t *local_c8;
  int_t *local_c0;
  undefined8 local_b8;
  double *local_b0;
  int *local_a8;
  int local_9c;
  uint local_98;
  int_t local_94;
  int_t *local_90;
  double local_88;
  int_t *local_80;
  double local_78;
  int_t *local_70;
  uint local_68;
  int local_64;
  long local_60;
  double local_58;
  long local_50;
  ulong local_48;
  long local_40;
  int_t *local_38;
  
  local_94 = 1;
  piVar18 = jperm + -1;
  local_c0 = irn;
  local_b0 = a;
  local_80 = ip;
  dVar25 = dmach("Overflow");
  *num = 0;
  uVar24 = (ulong)(uint)*n;
  bVar5 = true;
  if (0 < *n) {
    uVar11 = 0;
    do {
      *(undefined4 *)((long)iperm + uVar11) = 0;
      *(undefined4 *)((long)jperm + uVar11) = 0;
      *(undefined4 *)((long)pr + uVar11) = *(undefined4 *)((long)local_80 + uVar11);
      *(undefined8 *)((long)d__ + uVar11 * 2) = 0;
      uVar11 = uVar11 + 4;
    } while (uVar24 << 2 != uVar11);
    uVar24 = (ulong)(uint)*n;
    if (0 < *n) {
      lVar10 = 1;
      do {
        iVar9 = local_80[lVar10];
        lVar12 = (long)local_80[lVar10 + -1];
        if (local_80[lVar10 + -1] < iVar9) {
          dVar26 = -1.0;
          do {
            uVar7 = local_c0[lVar12 + -1];
            dVar27 = local_b0[lVar12 + -1];
            uVar23 = -(ulong)(-dVar27 <= dVar27);
            dVar27 = (double)(~uVar23 & (ulong)-dVar27 | (ulong)dVar27 & uVar23);
            if (d__[(long)(int)uVar7 + -1] <= dVar27 && dVar27 != d__[(long)(int)uVar7 + -1]) {
              d__[(long)(int)uVar7 + -1] = dVar27;
            }
            if (piVar18[lVar10] == 0) {
              if (dVar25 <= dVar27) {
                dVar26 = dVar25;
                if (iperm[(long)(int)uVar7 + -1] == 0) {
                  piVar18[lVar10] = uVar7;
                  iperm[(long)(int)uVar7 + -1] = (int)lVar10;
                  *num = *num + 1;
                }
              }
              else if (dVar26 < dVar27) {
                uVar11 = (ulong)uVar7;
                dVar26 = dVar27;
              }
            }
            lVar12 = lVar12 + 1;
          } while (iVar9 != lVar12);
          if (((dVar26 != -1.0) || (NAN(dVar26))) && (dVar26 < dVar25)) {
            iVar9 = (int)uVar11;
            dVar25 = dVar26;
            if (iperm[(long)iVar9 + -1] == 0) {
              iperm[(long)iVar9 + -1] = (int)lVar10;
              piVar18[lVar10] = iVar9;
              *num = *num + 1;
            }
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != uVar24 + 1);
      uVar7 = *n;
      uVar24 = (ulong)uVar7;
      bVar5 = (int)uVar7 < 1;
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          if (d__[uVar11] <= dVar25) {
            dVar25 = d__[uVar11];
          }
          uVar11 = uVar11 + 1;
        } while (uVar24 != uVar11);
        goto LAB_0011376e;
      }
    }
    bVar5 = true;
  }
LAB_0011376e:
  uVar7 = *num;
  if (uVar7 != (uint)uVar24) {
    piVar22 = pr + -1;
    if (!bVar5) {
      local_b8 = (double *)(local_c0 + -1);
      uVar11 = 1;
      do {
        if (piVar18[uVar11] == 0) {
          iVar9 = local_80[uVar11];
          lVar10 = (long)local_80[uVar11 - 1];
          if (local_80[uVar11 - 1] < iVar9) {
            do {
              dVar26 = local_b0[lVar10 + -1];
              uVar23 = -(ulong)(-dVar26 <= dVar26);
              if (dVar25 <= (double)(~uVar23 & (ulong)-dVar26 | (ulong)dVar26 & uVar23)) {
                iVar8 = local_c0[lVar10 + -1];
                iVar6 = iperm[(long)iVar8 + -1];
                lVar12 = (long)iVar6;
                if (lVar12 == 0) {
LAB_001138fe:
                  *num = *num + 1;
                  piVar18[uVar11] = iVar8;
                  iperm[(long)iVar8 + -1] = (int)uVar11;
                  piVar22[uVar11] = (int)lVar10 + 1;
                  break;
                }
                uVar7 = piVar22[lVar12];
                iVar3 = local_80[lVar12];
                if ((int)uVar7 < iVar3) {
                  uVar14 = ~uVar7;
                  lVar20 = 0;
                  do {
                    iVar4 = *(int *)((long)local_b8 + lVar20 * 4 + (long)(int)uVar7 * 4);
                    if ((iperm[(long)iVar4 + -1] == 0) &&
                       (dVar26 = local_b0[(long)(int)uVar7 + lVar20 + -1],
                       uVar23 = -(ulong)(-dVar26 <= dVar26),
                       dVar25 <= (double)(~uVar23 & (ulong)-dVar26 | (ulong)dVar26 & uVar23))) {
                      piVar18[lVar12] = iVar4;
                      iperm[(long)iVar4 + -1] = iVar6;
                      piVar22[lVar12] = -uVar14;
                      goto LAB_001138fe;
                    }
                    uVar14 = uVar14 - 1;
                    lVar20 = lVar20 + 1;
                  } while (iVar3 - uVar7 != (int)lVar20);
                  piVar22[lVar12] = iVar3;
                }
              }
              lVar10 = lVar10 + 1;
            } while (iVar9 != (int)lVar10);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uint)uVar24 + 1);
      uVar7 = *num;
      uVar24 = (ulong)(uint)*n;
    }
    uVar14 = (uint)uVar24;
    if (uVar7 != uVar14) {
      local_d8 = (uint *)n;
      local_c8 = piVar22;
      local_a8 = iperm;
      local_90 = piVar18;
      if (0 < (int)uVar14) {
        piVar13 = l + -1;
        uVar23 = (ulong)(uVar14 + 1);
        uVar11 = 0;
        do {
          d__[uVar11] = -1.0;
          l[uVar11] = 0;
          uVar11 = uVar11 + 1;
        } while (uVar24 != uVar11);
        uVar14 = *n;
        if (0 < (int)uVar14) {
          lVar10 = (ulong)uVar14 + 1;
          local_c0 = local_c0 + -1;
          local_b0 = local_b0 + -1;
          local_38 = q + -2;
          lVar12 = 1;
          pdVar15 = local_b0;
          piVar17 = local_c0;
          local_70 = piVar13;
          local_40 = lVar10;
          do {
            pdVar16 = pdVar15;
            piVar19 = piVar17;
            if (piVar18[lVar12] == 0) {
              local_e4 = *n + 1;
              local_d0 = (ulong)local_e4;
              piVar22[lVar12] = -1;
              iVar9 = local_80[lVar12];
              iVar8 = local_80[lVar12 + -1];
              local_60 = lVar12;
              if (iVar8 < iVar9) {
                lVar10 = 0;
                dVar26 = -1.0;
                local_b8 = (double *)((ulong)local_b8._4_4_ << 0x20);
                local_78 = dVar25;
                do {
                  uVar7 = piVar17[iVar8 + lVar10];
                  uVar23 = (ulong)uVar7;
                  dVar27 = pdVar15[iVar8 + lVar10];
                  uVar24 = -(ulong)(-dVar27 <= dVar27);
                  dVar27 = (double)(~uVar24 & (ulong)-dVar27 | (ulong)dVar27 & uVar24);
                  local_dc = uVar7;
                  if (dVar26 < dVar27) {
                    if (iperm[(long)(int)uVar7 + -1] == 0) {
                      local_9c = (int)lVar12;
                      iperm = local_a8;
                      dVar26 = dVar27;
                      local_98 = uVar7;
                      if (dVar25 <= dVar27) {
                        local_e0 = (uint)local_b8;
                        uVar24 = local_d0;
                        goto LAB_0011400e;
                      }
                    }
                    else {
                      d__[(long)(int)uVar7 + -1] = dVar27;
                      if (dVar25 <= dVar27) {
                        lVar12 = (long)(int)local_e4;
                        local_e4 = local_e4 - 1;
                        q[lVar12 + -2] = uVar7;
                      }
                      else {
                        iVar6 = (uint)local_b8 + 1;
                        local_b8 = (double *)CONCAT44(local_b8._4_4_,iVar6);
                        l[(long)(int)uVar7 + -1] = iVar6;
                        local_88 = dVar26;
                        mc64dd_((int_t *)&local_dc,(int_t *)local_d8,q,d__,l,&local_94);
                        piVar13 = local_70;
                        pdVar16 = local_b0;
                        piVar19 = local_c0;
                        dVar25 = local_78;
                        dVar26 = local_88;
                      }
                      local_c8[local_a8[(long)(int)uVar7 + -1]] = (int_t)local_60;
                      lVar12 = local_60;
                      iperm = local_a8;
                    }
                  }
                  lVar10 = lVar10 + 1;
                } while (iVar9 - iVar8 != (int)lVar10);
              }
              else {
                local_b8 = (double *)((ulong)local_b8._4_4_ << 0x20);
                dVar26 = -1.0;
              }
              local_e0 = (uint)local_b8;
              iVar9 = *num;
              uVar24 = local_d0;
              dVar27 = dVar26;
              if (0 < iVar9) {
                local_68 = (int)local_d0 - iVar9;
                local_48 = 1;
                local_d0 = (long)(int)local_d0;
                piVar18 = piVar19;
                local_64 = iVar9;
                do {
                  puVar1 = local_d8;
                  dVar27 = dVar25;
                  if (local_e4 == (uint)local_d0) {
                    piVar19 = piVar18;
                    uVar7 = local_e4;
                    if (local_e0 == 0) break;
                    uVar23 = (ulong)*q;
                    dVar27 = d__[uVar23 - 1];
                    if (dVar27 <= dVar26) {
                      uVar24 = (ulong)local_e4;
                      dVar27 = dVar26;
                      goto LAB_0011400e;
                    }
                    uVar7 = *local_d8;
                    iperm = local_a8;
                    if (0 < (int)uVar7) {
                      piVar21 = local_38 + (int)local_e4;
                      iVar9 = 1;
                      local_88 = dVar26;
                      local_78 = dVar27;
                      while( true ) {
                        iVar8 = iVar9;
                        mc64ed_((int_t *)&local_e0,(int_t *)puVar1,q,d__,l,&local_94);
                        l[(long)(int)uVar23 + -1] = 0;
                        *piVar21 = (int)uVar23;
                        if (local_e0 == 0) break;
                        uVar23 = (ulong)*q;
                        if ((d__[uVar23 - 1] != local_78) || (NAN(d__[uVar23 - 1]) || NAN(local_78))
                           ) break;
                        piVar21 = piVar21 + -1;
                        iVar9 = iVar8 + 1;
                        if ((int)uVar7 <= iVar8) break;
                      }
                      local_e4 = local_e4 - iVar8;
                      iperm = local_a8;
                      piVar13 = local_70;
                      pdVar16 = local_b0;
                      piVar18 = local_c0;
                      dVar26 = local_88;
                      dVar27 = local_78;
                    }
                  }
                  lVar10 = (long)q[local_d0 - 2];
                  uVar24 = local_d0 - 1;
                  dVar28 = d__[lVar10 + -1];
                  piVar13[lVar10] = (int_t)uVar24;
                  lVar10 = (long)iperm[lVar10 + -1];
                  iVar9 = local_80[lVar10];
                  iVar8 = local_80[lVar10 + -1];
                  piVar19 = piVar18;
                  dVar25 = dVar27;
                  if (iVar8 < iVar9) {
                    local_b8 = pdVar16 + iVar8;
                    lVar12 = 0;
                    local_d0 = uVar24;
                    local_78 = dVar27;
                    local_58 = dVar28;
                    local_50 = lVar10;
                    do {
                      uVar7 = piVar18[iVar8 + lVar12];
                      uVar23 = (ulong)uVar7;
                      local_dc = uVar7;
                      if ((long)piVar13[(int)uVar7] < (long)uVar24) {
                        dVar27 = local_b8[lVar12];
                        uVar11 = -(ulong)(-dVar27 <= dVar27);
                        dVar2 = (double)(~uVar11 & (ulong)-dVar27 | (ulong)dVar27 & uVar11);
                        dVar27 = dVar28;
                        if (dVar2 <= dVar28) {
                          dVar27 = dVar2;
                        }
                        if (dVar26 < dVar27) {
                          if (iperm[(long)(int)uVar7 + -1] == 0) {
                            local_9c = (int)lVar10;
                            dVar26 = dVar27;
                            local_98 = uVar7;
                            if (dVar25 <= dVar27) goto LAB_0011400e;
                          }
                          else {
                            dVar2 = d__[(long)(int)uVar7 + -1];
                            if ((dVar2 < dVar25) && (dVar2 < dVar27)) {
                              puVar1 = (uint *)(piVar13 + (int)uVar7);
                              d__[(long)(int)uVar7 + -1] = dVar27;
                              if (dVar25 <= dVar27) {
                                if ((dVar2 != -1.0) || (NAN(dVar2))) {
                                  local_88 = dVar26;
                                  mc64fd_((int_t *)puVar1,(int_t *)&local_e0,(int_t *)local_d8,q,d__
                                          ,l,&local_94);
                                  lVar10 = local_50;
                                  piVar13 = local_70;
                                  pdVar16 = local_b0;
                                  piVar19 = local_c0;
                                  dVar28 = local_58;
                                  dVar26 = local_88;
                                  dVar25 = local_78;
                                }
                                *puVar1 = 0;
                                lVar20 = (long)(int)local_e4;
                                local_e4 = local_e4 - 1;
                                q[lVar20 + -2] = uVar7;
                              }
                              else {
                                if ((dVar2 == -1.0) && (!NAN(dVar2))) {
                                  local_e0 = local_e0 + 1;
                                  *puVar1 = local_e0;
                                }
                                local_88 = dVar26;
                                mc64dd_((int_t *)&local_dc,(int_t *)local_d8,q,d__,l,&local_94);
                                lVar10 = local_50;
                                piVar13 = local_70;
                                pdVar16 = local_b0;
                                piVar19 = local_c0;
                                dVar28 = local_58;
                                dVar26 = local_88;
                                dVar25 = local_78;
                              }
                              local_c8[local_a8[(long)(int)uVar7 + -1]] = (int_t)lVar10;
                              uVar24 = local_d0;
                              iperm = local_a8;
                            }
                          }
                        }
                      }
                      lVar12 = lVar12 + 1;
                    } while (iVar9 - iVar8 != (int)lVar12);
                  }
                  iVar9 = (int)local_48;
                  local_48 = (ulong)(iVar9 + 1);
                  local_d0 = uVar24;
                  piVar18 = piVar19;
                  uVar7 = local_68;
                } while (iVar9 != local_64);
                uVar24 = (ulong)uVar7;
                dVar27 = dVar26;
              }
LAB_0011400e:
              if ((dVar27 != -1.0) || (NAN(dVar27))) {
                if (dVar27 <= dVar25) {
                  dVar25 = dVar27;
                }
                iVar9 = *num;
                *num = iVar9 + 1;
                if (iVar9 < -1) {
                  uVar23 = (ulong)local_98;
                }
                else {
                  iVar9 = iVar9 + 2;
                  iVar8 = local_9c;
                  uVar7 = local_98;
                  if (iVar9 < 2) {
                    iVar9 = 1;
                  }
                  do {
                    uVar14 = local_90[iVar8];
                    local_90[iVar8] = uVar7;
                    iperm[(long)(int)uVar7 + -1] = iVar8;
                    if (local_c8[iVar8] == -1) break;
                    iVar9 = iVar9 + -1;
                    iVar8 = local_c8[iVar8];
                    uVar7 = uVar14;
                  } while (iVar9 != 0);
                  uVar23 = (ulong)uVar7;
                }
              }
              uVar7 = *local_d8;
              iVar9 = (int)uVar24;
              if (iVar9 <= (int)uVar7) {
                lVar10 = -1;
                do {
                  uVar23 = (ulong)q[iVar9 + lVar10];
                  d__[uVar23 - 1] = -1.0;
                  piVar13[uVar23] = 0;
                  lVar10 = lVar10 + 1;
                } while (uVar7 - iVar9 != (int)lVar10);
              }
              if ((int)local_e4 < iVar9) {
                lVar10 = (long)(int)local_e4;
                do {
                  uVar23 = (ulong)q[lVar10 + -1];
                  d__[uVar23 - 1] = -1.0;
                  lVar10 = lVar10 + 1;
                } while (iVar9 != lVar10);
              }
              if (0 < (int)local_e0) {
                uVar11 = 0;
                do {
                  uVar23 = (ulong)q[uVar11];
                  d__[uVar23 - 1] = -1.0;
                  piVar13[uVar23] = 0;
                  uVar11 = uVar11 + 1;
                } while (local_e0 != uVar11);
              }
              local_dc = (uint)uVar23;
              lVar10 = local_40;
              lVar12 = local_60;
              n = (int_t *)local_d8;
              piVar18 = local_90;
              piVar22 = local_c8;
              local_d0 = uVar24;
            }
            lVar12 = lVar12 + 1;
            pdVar15 = pdVar16;
            piVar17 = piVar19;
          } while (lVar12 != lVar10);
          uVar14 = *n;
        }
      }
      if (0 < (int)uVar14 && *num != uVar14) {
        iVar9 = 0;
        memset(jperm,0,(ulong)uVar14 << 2);
        uVar7 = *n;
        if (0 < (int)uVar7) {
          lVar10 = 1;
          do {
            iVar6 = iVar9 + 1;
            iVar8 = iperm[lVar10 + -1];
            piVar13 = piVar18;
            if (iperm[lVar10 + -1] == 0) {
              iVar9 = iVar6;
              iVar8 = iVar6;
              piVar13 = piVar22;
            }
            piVar13[iVar8] = (int_t)lVar10;
            lVar10 = lVar10 + 1;
          } while ((ulong)uVar7 + 1 != lVar10);
          uVar7 = *n;
          if (0 < (int)uVar7) {
            iVar9 = 0;
            lVar10 = 1;
            do {
              if (jperm[lVar10 + -1] == 0) {
                lVar12 = (long)iVar9;
                iVar9 = iVar9 + 1;
                iperm[(long)piVar22[lVar12 + 1] + -1] = (int)lVar10;
              }
              lVar10 = lVar10 + 1;
            } while ((ulong)uVar7 + 1 != lVar10);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *pr, int_t *q, int_t *l, double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;
    double d__1, d__2, d__3;
    int_t c__1 = 1;

    /* Local variables */
    int_t i__, j, k;
    double a0;
    int_t i0, q0;
    double ai, di;
    int_t ii, jj, kk;
    double bv;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dnew;
    int_t jord, qlen, idum, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length */
/*   NE. A(K), K=1..NE, must be set to the value of the entry */
/*   that corresponds to IRN(K). It is not altered. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*    matching: IPERM(I) = 0 or row I is matched to column IPERM(I). */
/* NUM is INT_T variable. On exit, it contains the cardinality of the */
/*    matching stored in IPERM. */
/* IW is an INT_T work array of length 4N. */
/* DW is a REAL (DOUBLE PRECISION in D-version) work array of length N. */
/* Local variables */
/* Local parameters */
/* Intrinsic functions */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD, DMACH */
/*      DOUBLE PRECISION FD05AD, DMACH */
/* Set RINF to largest positive real number */
/* XSL  RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --l;
    --q;
    --pr;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    bv = rinf;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	d__[k] = 0.;
/* L10: */
    }
/* Scan columns of matrix; */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	a0 = -1.;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai > d__[i__]) {
		d__[i__] = ai;
	    }
	    if (jperm[j] != 0) {
		goto L30;
	    }
	    if (ai >= bv) {
		a0 = bv;
		if (iperm[i__] != 0) {
		    goto L30;
		}
		jperm[j] = i__;
		iperm[i__] = j;
		++(*num);
	    } else {
		if (ai <= a0) {
		    goto L30;
		}
		a0 = ai;
		i0 = i__;
	    }
L30:
	    ;
	}
	if (a0 != -1. && a0 < bv) {
	    bv = a0;
	    if (iperm[i0] != 0) {
		goto L20;
	    }
	    iperm[i0] = j;
	    jperm[j] = i0;
	    ++(*num);
	}
L20:
	;
    }
/* Update BV with smallest of all the largest maximum absolute values */
/* of the rows. */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
/* Computing MIN */
	d__1 = bv, d__2 = d__[i__];
	bv = min(d__1,d__2);
/* L25: */
    }
    if (*num == *n) {
	goto L1000;
    }
/* Rescan unassigned columns; improve initial assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L95;
	}
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai < bv) {
		goto L50;
	    }
	    if (iperm[i__] == 0) {
		goto L90;
	    }
	    jj = iperm[i__];
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L50;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] != 0) {
		    goto L70;
		}
		if ((d__1 = a[kk], abs(d__1)) >= bv) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L50:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = ii;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = i__;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = -1.;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is cost of shortest path to any unassigned row */
/* ISP is matrix position of unassigned row element in shortest path */
/* JSP is column index of unassigned row element in shortest path */
	csp = -1.;
/* Build shortest path tree starting from unassigned column JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = (d__1 = a[k], abs(d__1));
	    if (csp >= dnew) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		csp = dnew;
		isp = i__;
		jsp = j;
		if (csp >= bv) {
		    goto L160;
		}
	    } else {
		d__[i__] = dnew;
		if (dnew >= bv) {
/* Add row I to Q2 */
		    --low;
		    q[low] = i__;
		} else {
/* Add row I to Q, and push it */
		    ++qlen;
		    l[i__] = qlen;
		    mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		}
		jj = iperm[i__];
		pr[jj] = j;
	    }
L115:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract new rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (csp >= d__[i__]) {
		    goto L160;
		}
		bv = d__[i__];
		i__3 = *n;
		for (idum = 1; idum <= i__3; ++idum) {
		    mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__1);
		    l[i__] = 0;
		    --low;
		    q[low] = i__;
		    if (qlen == 0) {
			goto L153;
		    }
		    i__ = q[1];
		    if (d__[i__] != bv) {
			goto L153;
		    }
/* L152: */
		}
/* End of dummy loop; this point is never reached */
	    }
/* Move row Q0 */
L153:
	    --up;
	    q0 = q[up];
	    dq0 = d__[q0];
	    l[q0] = up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
/* Update D(I) */
		if (l[i__] >= up) {
		    goto L155;
		}
/* Computing MIN */
		d__2 = dq0, d__3 = (d__1 = a[k], abs(d__1));
		dnew = min(d__2,d__3);
		if (csp >= dnew) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		    csp = dnew;
		    isp = i__;
		    jsp = j;
		    if (csp >= bv) {
			goto L160;
		    }
		} else {
		    di = d__[i__];
		    if (di >= bv || di >= dnew) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew >= bv) {
/* Delete row I from Q (if necessary); add row I to Q2 */
			if (di != -1.) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__1);
			}
			l[i__] = 0;
			--low;
			q[low] = i__;
		    } else {
/* Add row I to Q (if necessary); push row I up Q */
			if (di == -1.) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		    }
/* Update tree */
		    jj = iperm[i__];
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = MINONE, no augmenting path is found */
L160:
	if (csp == -1.) {
	    goto L190;
	}
/* Update bottleneck value */
	bv = min(bv,csp);
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = isp;
	j = jsp;
	i__2 = *num + 1;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    i0 = jperm[j];
	    jperm[j] = i__;
	    iperm[i__] = j;
	    j = pr[j];
	    if (j == -1) {
		goto L190;
	    }
	    i__ = i0;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
L190:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = up - 1;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
/* L192: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* BV is bottleneck value of final matching */
    if (*num == *n) {
	goto L1000;
    }
/* Matrix is structurally singular, complete IPERM. */
/* JPERM, PR are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    pr[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (jperm[i__] != 0) {
	    goto L320;
	}
	++k;
	jdum = pr[k];
	iperm[jdum] = i__;
L320:
	;
    }
L1000:
    return 0;
}